

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O0

Result __thiscall spectest::JSONParser::ParseType(JSONParser *this,Type *out_type)

{
  bool bVar1;
  undefined8 uVar2;
  Type local_98;
  Type local_90;
  Type local_88;
  Type local_80;
  Type local_78;
  Type local_70;
  Type local_68;
  Type local_60;
  Type local_58;
  Type local_50;
  undefined4 local_48;
  Enum local_44;
  undefined1 local_40 [8];
  string type_str;
  Type *out_type_local;
  JSONParser *this_local;
  
  type_str.field_2._8_8_ = out_type;
  std::__cxx11::string::string((string *)local_40);
  local_44 = (Enum)ParseString(this,(string *)local_40);
  bVar1 = wabt::Failed((Result)local_44);
  if (bVar1) {
    wabt::Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_40,"i32");
    if (bVar1) {
      wabt::Type::Type(&local_50,I32);
      *(Type *)type_str.field_2._8_8_ = local_50;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_40,"f32");
      if (bVar1) {
        wabt::Type::Type(&local_58,F32);
        *(Type *)type_str.field_2._8_8_ = local_58;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_40,"i64");
        if (bVar1) {
          wabt::Type::Type(&local_60,I64);
          *(Type *)type_str.field_2._8_8_ = local_60;
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_40,"f64");
          if (bVar1) {
            wabt::Type::Type(&local_68,F64);
            *(Type *)type_str.field_2._8_8_ = local_68;
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_40,"v128");
            if (bVar1) {
              wabt::Type::Type(&local_70,V128);
              *(Type *)type_str.field_2._8_8_ = local_70;
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_40,"i8");
              if (bVar1) {
                wabt::Type::Type(&local_78,I8);
                *(Type *)type_str.field_2._8_8_ = local_78;
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_40,"i16");
                if (bVar1) {
                  wabt::Type::Type(&local_80,I16);
                  *(Type *)type_str.field_2._8_8_ = local_80;
                }
                else {
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_40,"funcref");
                  if (bVar1) {
                    wabt::Type::Type(&local_88,FuncRef);
                    *(Type *)type_str.field_2._8_8_ = local_88;
                  }
                  else {
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_40,"externref");
                    if (bVar1) {
                      wabt::Type::Type(&local_90,ExternRef);
                      *(Type *)type_str.field_2._8_8_ = local_90;
                    }
                    else {
                      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)local_40,"exnref");
                      if (!bVar1) {
                        uVar2 = std::__cxx11::string::c_str();
                        PrintError(this,"unknown type: \"%s\"",uVar2);
                        wabt::Result::Result((Result *)((long)&this_local + 4),Error);
                        goto LAB_0013ae50;
                      }
                      wabt::Type::Type(&local_98,ExnRef);
                      *(Type *)type_str.field_2._8_8_ = local_98;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    wabt::Result::Result((Result *)((long)&this_local + 4),Ok);
  }
LAB_0013ae50:
  local_48 = 1;
  std::__cxx11::string::~string((string *)local_40);
  return (Result)this_local._4_4_;
}

Assistant:

wabt::Result JSONParser::ParseType(Type* out_type) {
  std::string type_str;
  CHECK_RESULT(ParseString(&type_str));

  if (type_str == "i32") {
    *out_type = Type::I32;
  } else if (type_str == "f32") {
    *out_type = Type::F32;
  } else if (type_str == "i64") {
    *out_type = Type::I64;
  } else if (type_str == "f64") {
    *out_type = Type::F64;
  } else if (type_str == "v128") {
    *out_type = Type::V128;
  } else if (type_str == "i8") {
    *out_type = Type::I8;
  } else if (type_str == "i16") {
    *out_type = Type::I16;
  } else if (type_str == "funcref") {
    *out_type = Type::FuncRef;
  } else if (type_str == "externref") {
    *out_type = Type::ExternRef;
  } else if (type_str == "exnref") {
    *out_type = Type::ExnRef;
  } else {
    PrintError("unknown type: \"%s\"", type_str.c_str());
    return wabt::Result::Error;
  }
  return wabt::Result::Ok;
}